

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.h
# Opt level: O1

void Abc_SclManFree(SC_Man *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Que_t *pVVar4;
  float *pfVar5;
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  long lVar6;
  uint uVar7;
  Vec_Ptr_t *pVVar8;
  int iVar9;
  ulong uVar10;
  int *piVar11;
  ulong uVar12;
  int iVar13;
  Abc_Ntk_t *pAVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  
  pVVar8 = p->pNtk->vCis;
  if (0 < pVVar8->nSize) {
    lVar6 = 0;
    do {
      *(undefined4 *)((long)pVVar8->pArray[lVar6] + 0x38) = 0;
      lVar6 = lVar6 + 1;
      pVVar8 = p->pNtk->vCis;
    } while (lVar6 < pVVar8->nSize);
  }
  pAVar14 = p->pNtk;
  pVVar8 = pAVar14->vCos;
  if (0 < pVVar8->nSize) {
    lVar6 = 0;
    do {
      *(undefined4 *)((long)pVVar8->pArray[lVar6] + 0x38) = 0;
      lVar6 = lVar6 + 1;
      pAVar14 = p->pNtk;
      pVVar8 = pAVar14->vCos;
    } while (lVar6 < pVVar8->nSize);
  }
  pAVar14->pSCLib = (void *)0x0;
  if (pAVar14->vGates != (Vec_Int_t *)0x0) {
    piVar11 = pAVar14->vGates->pArray;
    if (piVar11 != (int *)0x0) {
      free(piVar11);
      pAVar14->vGates->pArray = (int *)0x0;
    }
    if (pAVar14->vGates != (Vec_Int_t *)0x0) {
      free(pAVar14->vGates);
      pAVar14->vGates = (Vec_Int_t *)0x0;
    }
  }
  if (p->vNodeIter != (Vec_Int_t *)0x0) {
    piVar11 = p->vNodeIter->pArray;
    if (piVar11 != (int *)0x0) {
      free(piVar11);
      p->vNodeIter->pArray = (int *)0x0;
    }
    if (p->vNodeIter != (Vec_Int_t *)0x0) {
      free(p->vNodeIter);
      p->vNodeIter = (Vec_Int_t *)0x0;
    }
  }
  pVVar4 = p->vNodeByGain;
  if (pVVar4 != (Vec_Que_t *)0x0) {
    if (pVVar4->pOrder != (int *)0x0) {
      free(pVVar4->pOrder);
      pVVar4->pOrder = (int *)0x0;
    }
    if (pVVar4->pHeap != (int *)0x0) {
      free(pVVar4->pHeap);
      pVVar4->pHeap = (int *)0x0;
    }
    free(pVVar4);
  }
  p->vNodeByGain = (Vec_Que_t *)0x0;
  if (p->vNode2Gain != (Vec_Flt_t *)0x0) {
    pfVar5 = p->vNode2Gain->pArray;
    if (pfVar5 != (float *)0x0) {
      free(pfVar5);
      p->vNode2Gain->pArray = (float *)0x0;
    }
    if (p->vNode2Gain != (Vec_Flt_t *)0x0) {
      free(p->vNode2Gain);
      p->vNode2Gain = (Vec_Flt_t *)0x0;
    }
  }
  if (p->vNode2Gate != (Vec_Int_t *)0x0) {
    piVar11 = p->vNode2Gate->pArray;
    if (piVar11 != (int *)0x0) {
      free(piVar11);
      p->vNode2Gate->pArray = (int *)0x0;
    }
    if (p->vNode2Gate != (Vec_Int_t *)0x0) {
      free(p->vNode2Gate);
      p->vNode2Gate = (Vec_Int_t *)0x0;
    }
  }
  if (p->vLoads2 != (Vec_Flt_t *)0x0) {
    pfVar5 = p->vLoads2->pArray;
    if (pfVar5 != (float *)0x0) {
      free(pfVar5);
      p->vLoads2->pArray = (float *)0x0;
    }
    if (p->vLoads2 != (Vec_Flt_t *)0x0) {
      free(p->vLoads2);
      p->vLoads2 = (Vec_Flt_t *)0x0;
    }
  }
  if (p->vLoads3 != (Vec_Flt_t *)0x0) {
    pfVar5 = p->vLoads3->pArray;
    if (pfVar5 != (float *)0x0) {
      free(pfVar5);
      p->vLoads3->pArray = (float *)0x0;
    }
    if (p->vLoads3 != (Vec_Flt_t *)0x0) {
      free(p->vLoads3);
      p->vLoads3 = (Vec_Flt_t *)0x0;
    }
  }
  if (p->vTimes2 != (Vec_Flt_t *)0x0) {
    pfVar5 = p->vTimes2->pArray;
    if (pfVar5 != (float *)0x0) {
      free(pfVar5);
      p->vTimes2->pArray = (float *)0x0;
    }
    if (p->vTimes2 != (Vec_Flt_t *)0x0) {
      free(p->vTimes2);
      p->vTimes2 = (Vec_Flt_t *)0x0;
    }
  }
  if (p->vTimes3 != (Vec_Flt_t *)0x0) {
    pfVar5 = p->vTimes3->pArray;
    if (pfVar5 != (float *)0x0) {
      free(pfVar5);
      p->vTimes3->pArray = (float *)0x0;
    }
    if (p->vTimes3 != (Vec_Flt_t *)0x0) {
      free(p->vTimes3);
      p->vTimes3 = (Vec_Flt_t *)0x0;
    }
  }
  if (p->vUpdates != (Vec_Int_t *)0x0) {
    piVar11 = p->vUpdates->pArray;
    if (piVar11 != (int *)0x0) {
      free(piVar11);
      p->vUpdates->pArray = (int *)0x0;
    }
    if (p->vUpdates != (Vec_Int_t *)0x0) {
      free(p->vUpdates);
      p->vUpdates = (Vec_Int_t *)0x0;
    }
  }
  if (p->vUpdates2 != (Vec_Int_t *)0x0) {
    piVar11 = p->vUpdates2->pArray;
    if (piVar11 != (int *)0x0) {
      free(piVar11);
      p->vUpdates2->pArray = (int *)0x0;
    }
    if (p->vUpdates2 != (Vec_Int_t *)0x0) {
      free(p->vUpdates2);
      p->vUpdates2 = (Vec_Int_t *)0x0;
    }
  }
  if (p->vGatesBest != (Vec_Int_t *)0x0) {
    piVar11 = p->vGatesBest->pArray;
    if (piVar11 != (int *)0x0) {
      free(piVar11);
      p->vGatesBest->pArray = (int *)0x0;
    }
    if (p->vGatesBest != (Vec_Int_t *)0x0) {
      free(p->vGatesBest);
      p->vGatesBest = (Vec_Int_t *)0x0;
    }
  }
  __ptr = p->vLevels;
  if (__ptr != (Vec_Wec_t *)0x0) {
    if (0 < __ptr->nCap) {
      lVar15 = 8;
      lVar6 = 0;
      do {
        __ptr_00 = *(void **)((long)&__ptr->pArray->nCap + lVar15);
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
          *(undefined8 *)((long)&__ptr->pArray->nCap + lVar15) = 0;
        }
        lVar6 = lVar6 + 1;
        lVar15 = lVar15 + 0x10;
      } while (lVar6 < __ptr->nCap);
    }
    if (__ptr->pArray != (Vec_Int_t *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (Vec_Int_t *)0x0;
    }
    __ptr->nCap = 0;
    __ptr->nSize = 0;
    free(__ptr);
    p->vLevels = (Vec_Wec_t *)0x0;
  }
  if (p->vChanged != (Vec_Int_t *)0x0) {
    piVar11 = p->vChanged->pArray;
    if (piVar11 != (int *)0x0) {
      free(piVar11);
      p->vChanged->pArray = (int *)0x0;
    }
    if (p->vChanged != (Vec_Int_t *)0x0) {
      free(p->vChanged);
      p->vChanged = (Vec_Int_t *)0x0;
    }
  }
  pVVar4 = p->vQue;
  iVar2 = pVVar4->nSize;
  if (iVar2 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0x124,"void Vec_QueCheck(Vec_Que_t *)");
  }
  iVar9 = pVVar4->nCap;
  if (iVar9 < iVar2) {
    __assert_fail("p->nSize <= p->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0x125,"void Vec_QueCheck(Vec_Que_t *)");
  }
  uVar1 = iVar2 - 1;
  uVar12 = 0;
  if (iVar2 != 1) {
    uVar12 = 0;
    do {
      if (pVVar4->pOrder[uVar12] < 1) {
        __assert_fail("p->pOrder[i] > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0x128,"void Vec_QueCheck(Vec_Que_t *)");
      }
      uVar12 = uVar12 + 1;
    } while (uVar1 != uVar12);
    uVar12 = (ulong)uVar1;
  }
  if ((int)uVar12 < iVar9) {
    piVar11 = pVVar4->pOrder + uVar12;
    do {
      if (*piVar11 != -1) {
        __assert_fail("p->pOrder[i] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0x12a,"void Vec_QueCheck(Vec_Que_t *)");
      }
      uVar7 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar7;
      piVar11 = piVar11 + 1;
    } while ((int)uVar7 < iVar9);
  }
  piVar11 = pVVar4->pHeap;
  if (*piVar11 != -1) {
    __assert_fail("p->pHeap[0] == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,300,"void Vec_QueCheck(Vec_Que_t *)");
  }
  if (iVar2 == 1) {
    uVar12 = 0;
  }
  else {
    uVar12 = 1;
    if (1 < (int)uVar1) {
      uVar12 = (ulong)uVar1;
    }
    uVar10 = 0;
    do {
      if (uVar10 != (uint)piVar11[pVVar4->pOrder[uVar10]]) {
        __assert_fail("p->pHeap[p->pOrder[i]] == i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0x12e,"void Vec_QueCheck(Vec_Que_t *)");
      }
      uVar10 = uVar10 + 1;
    } while (uVar12 != uVar10);
  }
  while (uVar12 = uVar12 + 1, (long)uVar12 < (long)iVar9) {
    if (piVar11[uVar12] != -1) {
      __assert_fail("p->pHeap[i] == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0x130,"void Vec_QueCheck(Vec_Que_t *)");
    }
  }
  if (iVar2 != 1) {
    iVar9 = 2;
    if (2 < iVar2) {
      iVar9 = iVar2;
    }
    uVar12 = 2;
    lVar6 = 0x300000000;
    iVar13 = 3;
    lVar15 = 0x200000000;
    do {
      if ((int)uVar12 < iVar2) {
        iVar3 = *(int *)((long)piVar11 + uVar12 * 2);
        pfVar5 = *pVVar4->pCostsFlt;
        if (pfVar5 == (float *)0x0) {
          fVar16 = (float)iVar3;
        }
        else {
          fVar16 = pfVar5[iVar3];
        }
        iVar3 = *(int *)((long)piVar11 + (lVar15 >> 0x1e));
        if (pfVar5 == (float *)0x0) {
          fVar17 = (float)iVar3;
        }
        else {
          fVar17 = pfVar5[iVar3];
        }
        if (fVar16 < fVar17) {
          __assert_fail("Vec_QuePrio(p, p->pHeap[i]) >= Vec_QuePrio(p, p->pHeap[child])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0x136,"void Vec_QueCheck(Vec_Que_t *)");
        }
      }
      if (iVar13 < iVar2) {
        iVar3 = *(int *)((long)piVar11 + uVar12 * 2);
        pfVar5 = *pVVar4->pCostsFlt;
        if (pfVar5 == (float *)0x0) {
          fVar16 = (float)iVar3;
        }
        else {
          fVar16 = pfVar5[iVar3];
        }
        iVar3 = *(int *)((long)piVar11 + (lVar6 >> 0x1e));
        if (pfVar5 == (float *)0x0) {
          fVar17 = (float)iVar3;
        }
        else {
          fVar17 = pfVar5[iVar3];
        }
        if (fVar16 < fVar17) {
          __assert_fail("Vec_QuePrio(p, p->pHeap[i]) >= Vec_QuePrio(p, p->pHeap[child])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0x139,"void Vec_QueCheck(Vec_Que_t *)");
        }
      }
      lVar15 = lVar15 + 0x200000000;
      uVar12 = uVar12 + 2;
      lVar6 = lVar6 + 0x200000000;
      iVar13 = iVar13 + 2;
    } while ((uint)(iVar9 * 2) != uVar12);
  }
  if (pVVar4->pOrder != (int *)0x0) {
    free(pVVar4->pOrder);
    pVVar4->pOrder = (int *)0x0;
  }
  if (pVVar4->pHeap != (int *)0x0) {
    free(pVVar4->pHeap);
    pVVar4->pHeap = (int *)0x0;
  }
  free(pVVar4);
  p->vQue = (Vec_Que_t *)0x0;
  if (p->vTimesOut != (Vec_Flt_t *)0x0) {
    pfVar5 = p->vTimesOut->pArray;
    if (pfVar5 != (float *)0x0) {
      free(pfVar5);
      p->vTimesOut->pArray = (float *)0x0;
    }
    if (p->vTimesOut != (Vec_Flt_t *)0x0) {
      free(p->vTimesOut);
      p->vTimesOut = (Vec_Flt_t *)0x0;
    }
  }
  if (p->vBestFans != (Vec_Int_t *)0x0) {
    piVar11 = p->vBestFans->pArray;
    if (piVar11 != (int *)0x0) {
      free(piVar11);
      p->vBestFans->pArray = (int *)0x0;
    }
    if (p->vBestFans != (Vec_Int_t *)0x0) {
      free(p->vBestFans);
      p->vBestFans = (Vec_Int_t *)0x0;
    }
  }
  if (p->vInDrive != (Vec_Flt_t *)0x0) {
    pfVar5 = p->vInDrive->pArray;
    if (pfVar5 != (float *)0x0) {
      free(pfVar5);
      p->vInDrive->pArray = (float *)0x0;
    }
    if (p->vInDrive != (Vec_Flt_t *)0x0) {
      free(p->vInDrive);
      p->vInDrive = (Vec_Flt_t *)0x0;
    }
  }
  if (p->vWireCaps != (Vec_Flt_t *)0x0) {
    pfVar5 = p->vWireCaps->pArray;
    if (pfVar5 != (float *)0x0) {
      free(pfVar5);
      p->vWireCaps->pArray = (float *)0x0;
    }
    if (p->vWireCaps != (Vec_Flt_t *)0x0) {
      free(p->vWireCaps);
      p->vWireCaps = (Vec_Flt_t *)0x0;
    }
  }
  if (p->pLoads != (SC_Pair *)0x0) {
    free(p->pLoads);
    p->pLoads = (SC_Pair *)0x0;
  }
  if (p->pDepts != (SC_Pair *)0x0) {
    free(p->pDepts);
    p->pDepts = (SC_Pair *)0x0;
  }
  if (p->pTimes != (SC_Pair *)0x0) {
    free(p->pTimes);
    p->pTimes = (SC_Pair *)0x0;
  }
  if (p->pSlews != (SC_Pair *)0x0) {
    free(p->pSlews);
    p->pSlews = (SC_Pair *)0x0;
  }
  if (p == (SC_Man *)0x0) {
    return;
  }
  free(p);
  return;
}

Assistant:

static inline void Abc_SclManFree( SC_Man * p )
{
    Abc_Obj_t * pObj;
    int i;
    // set CI/CO ids
    Abc_NtkForEachCi( p->pNtk, pObj, i )
        pObj->iData = 0;
    Abc_NtkForEachCo( p->pNtk, pObj, i )
        pObj->iData = 0;
    // other
    p->pNtk->pSCLib = NULL;
    Vec_IntFreeP( &p->pNtk->vGates );
    Vec_IntFreeP( &p->vNodeIter );
    Vec_QueFreeP( &p->vNodeByGain );
    Vec_FltFreeP( &p->vNode2Gain );
    Vec_IntFreeP( &p->vNode2Gate );
    // intermediate data
    Vec_FltFreeP( &p->vLoads2 );
    Vec_FltFreeP( &p->vLoads3 );
    Vec_FltFreeP( &p->vTimes2 );
    Vec_FltFreeP( &p->vTimes3 );
    Vec_IntFreeP( &p->vUpdates );
    Vec_IntFreeP( &p->vUpdates2 );
    Vec_IntFreeP( &p->vGatesBest );
    Vec_WecFreeP( &p->vLevels );
    Vec_IntFreeP( &p->vChanged );
//    Vec_QuePrint( p->vQue );
    Vec_QueCheck( p->vQue );
    Vec_QueFreeP( &p->vQue );
    Vec_FltFreeP( &p->vTimesOut );
    Vec_IntFreeP( &p->vBestFans );
    Vec_FltFreeP( &p->vInDrive );
    Vec_FltFreeP( &p->vWireCaps );
    ABC_FREE( p->pLoads );
    ABC_FREE( p->pDepts );
    ABC_FREE( p->pTimes );
    ABC_FREE( p->pSlews );
    ABC_FREE( p );
}